

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

Id_t __thiscall Potassco::AspifTextOutput::Data::addOutputString(Data *this,StringSpan *str)

{
  pointer *ppppVar1;
  iterator __position;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar2;
  uint *local_70;
  undefined8 local_68;
  uint local_60 [2];
  undefined4 uStack_58;
  undefined4 uStack_54;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_50;
  uint *local_48;
  undefined8 local_40;
  uint local_38 [2];
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,str->first,str->first + str->size);
  if (local_70 == local_60) {
    uStack_30 = uStack_58;
    uStack_2c = uStack_54;
    local_48 = local_38;
  }
  else {
    local_48 = local_70;
  }
  local_40 = local_68;
  local_68 = 0;
  local_60[0] = local_60[0] & 0xffffff00;
  local_28 = 0xffffffff;
  local_70 = local_60;
  pVar2 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_int>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->strings);
  local_50 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)((long)pVar2.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                       ._M_cur.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                + 8);
  __position._M_current =
       (this->out).
       super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->out).
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::pair<std::__cxx11::string_const,unsigned_int>*,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>*>>
    ::_M_realloc_insert<std::pair<std::__cxx11::string_const,unsigned_int>*>
              ((vector<std::pair<std::__cxx11::string_const,unsigned_int>*,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>*>>
                *)&this->out,__position,&local_50);
  }
  else {
    *__position._M_current = local_50;
    ppppVar1 = &(this->out).
                super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppppVar1 = *ppppVar1 + 1;
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return (int)((ulong)((long)(this->out).
                             super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->out).
                            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
}

Assistant:

Id_t addOutputString(const StringSpan& str) {
		out.push_back(&*strings.insert(StringMapVal(std::string(Potassco::begin(str), Potassco::end(str)), idMax)).first);
		return static_cast<Id_t>(out.size() - 1);
	}